

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoints
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  float *pfVar10;
  dxt1_endpoint_optimizer *this_00;
  unique_color *puVar11;
  byte *pbVar12;
  long lVar13;
  unique_color_projection *puVar14;
  unique_color_projection *puVar15;
  dxt1_solution_coordinates *in_RDX;
  vec<3U,_float> *in_RSI;
  long *in_RDI;
  float fVar16;
  float fVar17;
  float refinement_level;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  bool choose_solid_block;
  dxt1_solution_coordinates coords_4;
  int q_1;
  color_quad_u8 c_2;
  int s_3;
  int limit_1;
  int a_1;
  dxt1_solution_coordinates coords_3;
  int b_3;
  int g_3;
  int r_3;
  int i_7;
  color_quad_u8 hc;
  dxt1_solution_coordinates coords_2;
  int q;
  color_quad_u8 c_1;
  int s_2;
  int limit;
  int a;
  dxt1_solution_coordinates coords_1;
  int b_2;
  int g_2;
  int r_2;
  int i_6;
  color_quad_u8 lc;
  dxt1_solution_coordinates coords;
  uint j;
  uint i_5;
  int packed_color_1;
  int b_1;
  int g_1;
  int r_1;
  vec3F probe_high_color;
  int s_1;
  int x_1;
  int ls_1;
  uint i_4;
  vec3F initial_probe_high_color;
  uint num_high_trials;
  int packed_color;
  int b;
  int g;
  int r;
  vec3F probe_low_color;
  int s;
  int x;
  int ls;
  uint i_3;
  vec3F initial_probe_low_color;
  uint num_low_trials;
  int prev_packed_color [2];
  uint64 prev_best_error;
  color_quad_u8 high;
  color_quad_u8 low;
  uint pass;
  uint iEnd;
  uint i_2;
  int64 delta;
  uint i_1;
  int64 average_projection;
  vector<crnlib::unique_color_projection> evaluated_color_projections;
  uint c;
  int d [3];
  vec3F scaled_principle_axis [2];
  uint probe_high [31];
  uint probe_low [31];
  uint i;
  uint num_prev_results;
  float dist_per_trial;
  uint probe_range;
  int16 *pProbe_table;
  uint num_passes;
  vec3F orig_high_color;
  vec3F orig_low_color;
  dxt1_endpoint_optimizer *in_stack_00001b70;
  undefined1 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffac9;
  undefined1 in_stack_fffffffffffffaca;
  undefined1 in_stack_fffffffffffffacb;
  uint16 in_stack_fffffffffffffacc;
  undefined1 in_stack_ffffffffffffface;
  uchar in_stack_fffffffffffffacf;
  potential_solution *in_stack_fffffffffffffad0;
  potential_solution *in_stack_fffffffffffffad8;
  uint16 in_stack_fffffffffffffae0;
  uint16 in_stack_fffffffffffffae2;
  uint16 in_stack_fffffffffffffae4;
  undefined1 in_stack_fffffffffffffae6;
  uchar in_stack_fffffffffffffae7;
  vec<3U,_float> *in_stack_fffffffffffffae8;
  uint in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffafd;
  uint16 in_stack_fffffffffffffafe;
  float *in_stack_fffffffffffffb28;
  dxt1_solution_coordinates *in_stack_fffffffffffffb30;
  dxt1_solution_coordinates *coords_00;
  uint in_stack_fffffffffffffb38;
  float in_stack_fffffffffffffb3c;
  dxt1_endpoint_optimizer *in_stack_fffffffffffffb40;
  uint in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  vec<3U,_float> *local_348;
  bool local_32d;
  dxt1_solution_coordinates local_32c;
  int local_328;
  color_quad<unsigned_char,_int> local_324;
  int local_320;
  int local_31c;
  uint local_318;
  color_quad<unsigned_char,_int> local_314;
  dxt1_solution_coordinates local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2fc;
  dxt1_solution_coordinates local_2f8;
  int local_2f4;
  color_quad<unsigned_char,_int> local_2f0;
  int local_2ec;
  int local_2e8;
  uint local_2e4;
  color_quad<unsigned_char,_int> local_2e0;
  dxt1_solution_coordinates local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_2c8;
  dxt1_solution_coordinates local_2c4;
  uint local_2c0;
  uint local_2bc;
  float local_2b8;
  uint local_2b4;
  int local_2b0;
  int local_2ac;
  vec<3U,_float> local_29c;
  uint local_290;
  int local_28c;
  uint local_288;
  uint local_284;
  uint local_268;
  float local_264;
  uint local_260;
  int local_25c;
  int local_258;
  vec<3U,_float> local_248;
  uint local_23c;
  int local_238;
  uint local_234;
  uint local_230;
  uint local_214;
  float local_210 [2];
  long local_208;
  vec<3U,_float> local_200;
  vec<3U,_float> local_1f0;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  long local_1d0;
  uint local_1c8;
  long local_1b8;
  vector<crnlib::unique_color_projection> local_1b0;
  uint local_1a0;
  int local_19c [3];
  vec<3U,_float> local_190;
  vec<3U,_float> local_184;
  vec<3U,_float> local_178;
  vec<3U,_float> vStack_16c;
  vec<3U,_float> avStack_160 [11];
  float afStack_d8 [34];
  uint local_50;
  uint local_4c;
  undefined4 local_48;
  uint local_44;
  undefined8 *local_40;
  uint local_34;
  vec<3U,_float> local_30;
  vec<3U,_float> local_24;
  dxt1_solution_coordinates *local_18;
  vec<3U,_float> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  vec<3U,_float>::vec(&local_24,in_RSI);
  vec<3U,_float>::vec(&local_30,(vec<3U,_float> *)local_18);
  potential_solution::clear(in_stack_fffffffffffffad0);
  local_48 = 0x3c800000;
  switch(*(undefined4 *)(*in_RDI + 0x18)) {
  case 0:
    local_40 = &g_fast_probe_table;
    local_44 = 4;
    local_48 = 0x3cddb3d7;
    local_34 = 1;
    break;
  case 1:
    local_40 = &g_fast_probe_table;
    local_44 = 4;
    local_48 = 0x3cddb3d7;
    local_34 = 2;
    break;
  case 2:
    local_40 = (undefined8 *)g_normal_probe_table;
    local_44 = 5;
    local_48 = 0x3cddb3d7;
    local_34 = 2;
    break;
  case 3:
    local_40 = (undefined8 *)g_better_probe_table;
    local_44 = 10;
    local_34 = 2;
    break;
  default:
    local_40 = (undefined8 *)g_uber_probe_table;
    local_44 = 0xf;
    local_34 = 4;
  }
  if ((*(byte *)(*in_RDI + 0x20) & 1) != 0) {
    local_4c = math::minimum<unsigned_int>(4,*(uint *)(in_RDI + 0x121));
    for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
      evaluate_solution((dxt1_endpoint_optimizer *)
                        CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                        in_stack_fffffffffffffb30,SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0))
      ;
    }
    if (in_RDI[0x12e] == 0) {
      return_solution((dxt1_endpoint_optimizer *)
                      CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      return;
    }
  }
  if (2 < *(uint *)(*in_RDI + 0x18)) {
    try_median4((dxt1_endpoint_optimizer *)
                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                (vec3F *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                (vec3F *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  }
  local_348 = &local_178;
  do {
    vec<3U,_float>::vec(local_348);
    local_348 = local_348 + 1;
  } while (local_348 != avStack_160);
  crnlib::operator*((vec<3U,_float> *)in_stack_fffffffffffffad8,
                    (float)((ulong)in_stack_fffffffffffffad0 >> 0x20));
  vec<3U,_float>::operator=(&vStack_16c,&local_184);
  pfVar10 = vec<3U,_float>::operator[](&vStack_16c,0);
  *pfVar10 = *pfVar10 * 31.0;
  pfVar10 = vec<3U,_float>::operator[](&vStack_16c,1);
  *pfVar10 = *pfVar10 * 63.0;
  pfVar10 = vec<3U,_float>::operator[](&vStack_16c,2);
  *pfVar10 = *pfVar10 * 31.0;
  vec<3U,_float>::operator-(in_stack_fffffffffffffae8);
  vec<3U,_float>::operator=(&local_178,&local_190);
  pfVar10 = vec<3U,_float>::operator[](local_10,0);
  fVar16 = math::clamp<float>(*pfVar10 * 31.0,0.0,31.0);
  pfVar10 = vec<3U,_float>::operator[](local_10,0);
  *pfVar10 = fVar16;
  pfVar10 = vec<3U,_float>::operator[](local_10,1);
  fVar16 = math::clamp<float>(*pfVar10 * 63.0,0.0,63.0);
  pfVar10 = vec<3U,_float>::operator[](local_10,1);
  *pfVar10 = fVar16;
  pfVar10 = vec<3U,_float>::operator[](local_10,2);
  fVar16 = math::clamp<float>(*pfVar10 * 31.0,0.0,31.0);
  pfVar10 = vec<3U,_float>::operator[](local_10,2);
  *pfVar10 = fVar16;
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,0);
  fVar16 = math::clamp<float>(*pfVar10 * 31.0,0.0,31.0);
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,0);
  *pfVar10 = fVar16;
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,1);
  fVar16 = math::clamp<float>(*pfVar10 * 63.0,0.0,63.0);
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,1);
  *pfVar10 = fVar16;
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,2);
  fVar17 = math::clamp<float>(*pfVar10 * 31.0,0.0,31.0);
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,2);
  *pfVar10 = fVar17;
  for (local_1a0 = 0; local_1a0 < 3; local_1a0 = local_1a0 + 1) {
    vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,local_1a0);
    vec<3U,_float>::operator[](local_10,local_1a0);
    iVar8 = math::float_to_int_round(0.0);
    local_19c[local_1a0] = iVar8;
  }
  vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 9));
  vector<crnlib::unique_color_projection>::vector
            ((vector<crnlib::unique_color_projection> *)in_stack_fffffffffffffad0,
             CONCAT13(in_stack_fffffffffffffacf,
                      CONCAT12(in_stack_ffffffffffffface,in_stack_fffffffffffffacc)));
  refinement_level = (float)local_19c[0];
  this_00 = (dxt1_endpoint_optimizer *)vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,0);
  fVar1 = *(float *)&this_00->m_pParams;
  pfVar10 = vec<3U,_float>::operator[](local_10,0);
  fVar18 = refinement_level * (fVar1 + *pfVar10);
  fVar19 = (float)local_19c[1];
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,1);
  fVar1 = *pfVar10;
  pfVar10 = vec<3U,_float>::operator[](local_10,1);
  fVar19 = fVar19 * (fVar1 + *pfVar10);
  fVar20 = (float)local_19c[2];
  pfVar10 = vec<3U,_float>::operator[]((vec<3U,_float> *)local_18,2);
  fVar1 = *pfVar10;
  pfVar10 = vec<3U,_float>::operator[](local_10,2);
  local_1b8 = (long)(fVar18 * 4.0 + fVar19 + fVar19 + fVar20 * (fVar1 + *pfVar10) * 4.0);
  for (local_1c8 = 0; uVar4 = local_1c8,
      uVar9 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 9)),
      iVar8 = local_19c[0], uVar4 < uVar9; local_1c8 = local_1c8 + 1) {
    puVar11 = vector<crnlib::unique_color>::operator[]
                        ((vector<crnlib::unique_color> *)(in_RDI + 9),local_1c8);
    pbVar12 = color_quad<unsigned_char,_int>::operator[](&puVar11->m_color,0);
    iVar5 = local_19c[1];
    bVar2 = *pbVar12;
    puVar11 = vector<crnlib::unique_color>::operator[]
                        ((vector<crnlib::unique_color> *)(in_RDI + 9),local_1c8);
    pbVar12 = color_quad<unsigned_char,_int>::operator[](&puVar11->m_color,1);
    iVar6 = local_19c[2];
    bVar3 = *pbVar12;
    puVar11 = vector<crnlib::unique_color>::operator[]
                        ((vector<crnlib::unique_color> *)(in_RDI + 9),local_1c8);
    pbVar12 = color_quad<unsigned_char,_int>::operator[](&puVar11->m_color,2);
    lVar13 = (int)(iVar8 * (uint)bVar2 + iVar5 * (uint)bVar3 + iVar6 * (uint)*pbVar12) - local_1b8;
    local_1d0 = lVar13;
    puVar11 = vector<crnlib::unique_color>::operator[]
                        ((vector<crnlib::unique_color> *)(in_RDI + 9),local_1c8);
    uVar4 = puVar11->m_weight;
    puVar14 = vector<crnlib::unique_color_projection>::operator[](&local_1b0,local_1c8);
    puVar14->projection = lVar13 * (ulong)uVar4;
    vector<crnlib::unique_color>::operator[]((vector<crnlib::unique_color> *)(in_RDI + 9),local_1c8)
    ;
    vector<crnlib::unique_color_projection>::operator[](&local_1b0,local_1c8);
    unique_color::operator=
              ((unique_color *)in_stack_fffffffffffffad0,
               (unique_color *)
               CONCAT17(in_stack_fffffffffffffacf,
                        CONCAT16(in_stack_ffffffffffffface,
                                 CONCAT24(in_stack_fffffffffffffacc,
                                          CONCAT13(in_stack_fffffffffffffacb,
                                                   CONCAT12(in_stack_fffffffffffffaca,
                                                            CONCAT11(in_stack_fffffffffffffac9,
                                                                     in_stack_fffffffffffffac8))))))
              );
  }
  puVar14 = vector<crnlib::unique_color_projection>::begin(&local_1b0);
  puVar15 = vector<crnlib::unique_color_projection>::end(&local_1b0);
  std::sort<crnlib::unique_color_projection*,crnlib::__0>(puVar14,puVar15);
  local_1d8 = 0;
  uVar9 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 9));
  local_1dc = uVar9;
  for (; local_1d8 < local_1dc; local_1d8 = local_1d8 + 1) {
    if ((local_1d8 & 1) == 0) {
      in_stack_fffffffffffffb88 = (local_1dc - 1) - (local_1d8 >> 1);
    }
    else {
      in_stack_fffffffffffffb88 = local_1d8 >> 1;
    }
    vector<crnlib::unique_color_projection>::operator[](&local_1b0,in_stack_fffffffffffffb88);
    vector<crnlib::unique_color>::operator[]((vector<crnlib::unique_color> *)(in_RDI + 9),local_1d8)
    ;
    unique_color::operator=
              ((unique_color *)in_stack_fffffffffffffad0,
               (unique_color *)
               CONCAT17(in_stack_fffffffffffffacf,
                        CONCAT16(in_stack_ffffffffffffface,
                                 CONCAT24(in_stack_fffffffffffffacc,
                                          CONCAT13(in_stack_fffffffffffffacb,
                                                   CONCAT12(in_stack_fffffffffffffaca,
                                                            CONCAT11(in_stack_fffffffffffffac9,
                                                                     in_stack_fffffffffffffac8))))))
              );
  }
  for (local_1e0 = 0; local_1e0 < local_34; local_1e0 = local_1e0 + 1) {
    if (local_1e0 != 0) {
      dxt1_block::unpack_color
                (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,in_stack_fffffffffffffaf8
                );
      vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffad0,
                          (float)CONCAT13(in_stack_fffffffffffffacf,
                                          CONCAT12(in_stack_ffffffffffffface,
                                                   in_stack_fffffffffffffacc)),
                          (float)CONCAT13(in_stack_fffffffffffffacb,
                                          CONCAT12(in_stack_fffffffffffffaca,
                                                   CONCAT11(in_stack_fffffffffffffac9,
                                                            in_stack_fffffffffffffac8))),0.0);
      vec<3U,_float>::operator=(local_10,&local_1f0);
      dxt1_block::unpack_color
                (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,in_stack_fffffffffffffaf8
                );
      vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffad0,
                          (float)CONCAT13(in_stack_fffffffffffffacf,
                                          CONCAT12(in_stack_ffffffffffffface,
                                                   in_stack_fffffffffffffacc)),
                          (float)CONCAT13(in_stack_fffffffffffffacb,
                                          CONCAT12(in_stack_fffffffffffffaca,
                                                   CONCAT11(in_stack_fffffffffffffac9,
                                                            in_stack_fffffffffffffac8))),0.0);
      vec<3U,_float>::operator=((vec<3U,_float> *)local_18,&local_200);
    }
    local_208 = in_RDI[0x12e];
    if (local_208 == 0) break;
    local_210[0] = -NAN;
    local_210[1] = -NAN;
    local_214 = 0;
    vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffad0,
                        (float)CONCAT13(in_stack_fffffffffffffacf,
                                        CONCAT12(in_stack_ffffffffffffface,in_stack_fffffffffffffacc
                                                )));
    operator+(in_stack_fffffffffffffae8,
              (vec<3U,_float> *)
              CONCAT17(in_stack_fffffffffffffae7,
                       CONCAT16(in_stack_fffffffffffffae6,
                                CONCAT24(in_stack_fffffffffffffae4,
                                         CONCAT22(in_stack_fffffffffffffae2,
                                                  in_stack_fffffffffffffae0)))));
    for (local_230 = 0; local_230 < local_44; local_230 = local_230 + 1) {
      local_238 = (int)*(short *)((long)local_40 + (ulong)local_230 * 2);
      local_23c = (uint)(local_230 == 0);
      local_234 = local_23c;
      for (; (int)local_23c < 2; local_23c = local_23c + 1) {
        crnlib::operator*((vec<3U,_float> *)in_stack_fffffffffffffad8,
                          (float)((ulong)in_stack_fffffffffffffad0 >> 0x20));
        operator+(in_stack_fffffffffffffae8,
                  (vec<3U,_float> *)
                  CONCAT17(in_stack_fffffffffffffae7,
                           CONCAT16(in_stack_fffffffffffffae6,
                                    CONCAT24(in_stack_fffffffffffffae4,
                                             CONCAT22(in_stack_fffffffffffffae2,
                                                      in_stack_fffffffffffffae0)))));
        pfVar10 = vec<3U,_float>::operator[](&local_248,0);
        dVar21 = std::floor((double)(ulong)(uint)*pfVar10);
        local_258 = math::clamp<int>((int)SUB84(dVar21,0),0,0x1f);
        pfVar10 = vec<3U,_float>::operator[](&local_248,1);
        dVar21 = std::floor((double)(ulong)(uint)*pfVar10);
        local_25c = math::clamp<int>((int)SUB84(dVar21,0),0,0x3f);
        in_stack_fffffffffffffb40 =
             (dxt1_endpoint_optimizer *)vec<3U,_float>::operator[](&local_248,2);
        dVar21 = std::floor((double)(ulong)(uint)*(float *)&in_stack_fffffffffffffb40->m_pParams);
        in_stack_fffffffffffffb3c = SUB84(dVar21,0);
        in_stack_fffffffffffffb38 = math::clamp<int>((int)in_stack_fffffffffffffb3c,0,0x1f);
        local_264 = (float)(in_stack_fffffffffffffb38 | local_25c << 5 | local_258 << 0xb);
        if (local_264 != local_210[(int)local_23c]) {
          afStack_d8[local_214] = local_264;
          local_210[(int)local_23c] = local_264;
          local_214 = local_214 + 1;
        }
        local_260 = in_stack_fffffffffffffb38;
      }
    }
    local_210[0] = -NAN;
    local_210[1] = -NAN;
    local_268 = 0;
    coords_00 = local_18;
    vec<3U,_float>::vec((vec<3U,_float> *)in_stack_fffffffffffffad0,
                        (float)CONCAT13(in_stack_fffffffffffffacf,
                                        CONCAT12(in_stack_ffffffffffffface,in_stack_fffffffffffffacc
                                                )));
    operator+(in_stack_fffffffffffffae8,
              (vec<3U,_float> *)
              CONCAT17(in_stack_fffffffffffffae7,
                       CONCAT16(in_stack_fffffffffffffae6,
                                CONCAT24(in_stack_fffffffffffffae4,
                                         CONCAT22(in_stack_fffffffffffffae2,
                                                  in_stack_fffffffffffffae0)))));
    for (local_284 = 0; local_284 < local_44; local_284 = local_284 + 1) {
      local_28c = (int)*(short *)((long)local_40 + (ulong)local_284 * 2);
      local_290 = (uint)(local_284 == 0);
      local_288 = local_290;
      for (; (int)local_290 < 2; local_290 = local_290 + 1) {
        crnlib::operator*((vec<3U,_float> *)in_stack_fffffffffffffad8,
                          (float)((ulong)in_stack_fffffffffffffad0 >> 0x20));
        operator+(in_stack_fffffffffffffae8,
                  (vec<3U,_float> *)
                  CONCAT17(in_stack_fffffffffffffae7,
                           CONCAT16(in_stack_fffffffffffffae6,
                                    CONCAT24(in_stack_fffffffffffffae4,
                                             CONCAT22(in_stack_fffffffffffffae2,
                                                      in_stack_fffffffffffffae0)))));
        in_stack_fffffffffffffb28 = vec<3U,_float>::operator[](&local_29c,0);
        dVar21 = std::floor((double)(ulong)(uint)*in_stack_fffffffffffffb28);
        local_2ac = math::clamp<int>((int)SUB84(dVar21,0),0,0x1f);
        pfVar10 = vec<3U,_float>::operator[](&local_29c,1);
        dVar21 = std::floor((double)(ulong)(uint)*pfVar10);
        local_2b0 = math::clamp<int>((int)SUB84(dVar21,0),0,0x3f);
        pfVar10 = vec<3U,_float>::operator[](&local_29c,2);
        dVar21 = std::floor((double)(ulong)(uint)*pfVar10);
        local_2b4 = math::clamp<int>((int)SUB84(dVar21,0),0,0x1f);
        local_2b8 = (float)(local_2b4 | local_2b0 << 5 | local_2ac << 0xb);
        if (local_2b8 != local_210[(int)local_290]) {
          avStack_160[0].m_s[(ulong)local_268 + 2] = local_2b8;
          local_210[(int)local_290] = local_2b8;
          local_268 = local_268 + 1;
        }
      }
    }
    for (local_2bc = 0; local_2bc < local_214; local_2bc = local_2bc + 1) {
      for (local_2c0 = 0; local_2c0 < local_268; local_2c0 = local_2c0 + 1) {
        dxt1_solution_coordinates::dxt1_solution_coordinates
                  (&local_2c4,*(uint16 *)(afStack_d8 + local_2bc),
                   *(uint16 *)(avStack_160[0].m_s + (ulong)local_2c0 + 2));
        dxt1_solution_coordinates::canonicalize(&in_stack_fffffffffffffad0->m_coords);
        evaluate_solution((dxt1_endpoint_optimizer *)
                          CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),coords_00,
                          SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
      }
    }
    if (1 < *(uint *)(*in_RDI + 0x18)) {
      dxt1_block::unpack_color
                (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,in_stack_fffffffffffffaf8
                );
      for (local_2cc = 0; local_2cc < 0x1a; local_2cc = local_2cc + 1) {
        local_2d0 = (uint)local_2c8.field_0.r + (int)(char)g_adjacency[(long)local_2cc * 3];
        if (((((-1 < local_2d0) && (local_2d0 < 0x20)) &&
             (local_2d4 = (uint)local_2c8.field_0.g +
                          (int)(char)g_adjacency[(long)local_2cc * 3 + 1], -1 < local_2d4)) &&
            ((local_2d4 < 0x40 &&
             (local_2d8 = (uint)local_2c8.field_0.b +
                          (int)(char)g_adjacency[(long)local_2cc * 3 + 2], -1 < local_2d8)))) &&
           (local_2d8 < 0x20)) {
          in_stack_fffffffffffffafe =
               dxt1_block::pack_color
                         ((uint)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                          (uint)in_stack_fffffffffffffad0,
                          CONCAT13(in_stack_fffffffffffffacf,
                                   CONCAT12(in_stack_ffffffffffffface,in_stack_fffffffffffffacc)),
                          (bool)in_stack_fffffffffffffacb,0);
          dxt1_solution_coordinates::dxt1_solution_coordinates
                    (&local_2dc,in_stack_fffffffffffffafe,*(uint16 *)((long)in_RDI + 0x95a));
          dxt1_solution_coordinates::canonicalize(&in_stack_fffffffffffffad0->m_coords);
          evaluate_solution((dxt1_endpoint_optimizer *)
                            CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),coords_00,
                            SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
        }
      }
      if (*(int *)(*in_RDI + 0x18) == 4) {
        dxt1_block::unpack_color
                  (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,
                   in_stack_fffffffffffffaf8);
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)&local_2c8.field_0,&local_2e0);
        for (local_2e4 = 0; (int)local_2e4 < 3; local_2e4 = local_2e4 + 1) {
          local_2e8 = 0x1f;
          if (local_2e4 == 1) {
            local_2e8 = 0x3f;
          }
          for (local_2ec = -2; local_2ec < 3; local_2ec = local_2ec + 4) {
            color_quad<unsigned_char,_int>::color_quad
                      (&local_2f0,(color_quad<unsigned_char,_int> *)&local_2c8.field_0);
            pbVar12 = color_quad<unsigned_char,_int>::operator[](&local_2f0,local_2e4);
            local_2f4 = (uint)*pbVar12 + local_2ec;
            if ((-1 < local_2f4) && (local_2f4 <= local_2e8)) {
              in_stack_fffffffffffffae7 = (uchar)local_2f4;
              in_stack_fffffffffffffae8 =
                   (vec<3U,_float> *)
                   color_quad<unsigned_char,_int>::operator[](&local_2f0,local_2e4);
              *(uchar *)in_stack_fffffffffffffae8->m_s = in_stack_fffffffffffffae7;
              in_stack_fffffffffffffae4 =
                   dxt1_block::pack_color
                             ((color_quad_u8 *)
                              CONCAT17(in_stack_fffffffffffffae7,
                                       CONCAT16(in_stack_fffffffffffffae6,
                                                CONCAT24(in_stack_fffffffffffffae4,
                                                         CONCAT22(in_stack_fffffffffffffae2,
                                                                  in_stack_fffffffffffffae0)))),
                              SUB81((ulong)in_stack_fffffffffffffad8 >> 0x38,0),
                              (uint)in_stack_fffffffffffffad8);
              dxt1_solution_coordinates::dxt1_solution_coordinates
                        (&local_2f8,in_stack_fffffffffffffae4,*(uint16 *)((long)in_RDI + 0x95a));
              dxt1_solution_coordinates::canonicalize(&in_stack_fffffffffffffad0->m_coords);
              evaluate_solution((dxt1_endpoint_optimizer *)
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                coords_00,SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
            }
          }
        }
      }
      dxt1_block::unpack_color
                (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,in_stack_fffffffffffffaf8
                );
      for (local_300 = 0; local_300 < 0x1a; local_300 = local_300 + 1) {
        local_304 = (uint)local_2fc.field_0.r + (int)(char)g_adjacency[(long)local_300 * 3];
        if ((((-1 < local_304) && (local_304 < 0x20)) &&
            (local_308 = (uint)local_2fc.field_0.g + (int)(char)g_adjacency[(long)local_300 * 3 + 1]
            , -1 < local_308)) &&
           (((local_308 < 0x40 &&
             (local_30c = (uint)local_2fc.field_0.b +
                          (int)(char)g_adjacency[(long)local_300 * 3 + 2], -1 < local_30c)) &&
            (local_30c < 0x20)))) {
          in_stack_fffffffffffffae0 = *(uint16 *)(in_RDI + 299);
          in_stack_fffffffffffffae2 =
               dxt1_block::pack_color
                         ((uint)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                          (uint)in_stack_fffffffffffffad0,
                          CONCAT13(in_stack_fffffffffffffacf,
                                   CONCAT12(in_stack_ffffffffffffface,in_stack_fffffffffffffacc)),
                          (bool)in_stack_fffffffffffffacb,0);
          dxt1_solution_coordinates::dxt1_solution_coordinates
                    (&local_310,in_stack_fffffffffffffae0,in_stack_fffffffffffffae2);
          dxt1_solution_coordinates::canonicalize(&in_stack_fffffffffffffad0->m_coords);
          evaluate_solution((dxt1_endpoint_optimizer *)
                            CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),coords_00,
                            SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
        }
      }
      if (*(int *)(*in_RDI + 0x18) == 4) {
        dxt1_block::unpack_color
                  (in_stack_fffffffffffffafe,(bool)in_stack_fffffffffffffafd,
                   in_stack_fffffffffffffaf8);
        color_quad<unsigned_char,_int>::operator=
                  ((color_quad<unsigned_char,_int> *)&local_2fc.field_0,&local_314);
        for (local_318 = 0; (int)local_318 < 3; local_318 = local_318 + 1) {
          local_31c = 0x1f;
          if (local_318 == 1) {
            local_31c = 0x3f;
          }
          for (local_320 = -2; local_320 < 3; local_320 = local_320 + 4) {
            color_quad<unsigned_char,_int>::color_quad
                      (&local_324,(color_quad<unsigned_char,_int> *)&local_2fc.field_0);
            in_stack_fffffffffffffad8 =
                 (potential_solution *)
                 color_quad<unsigned_char,_int>::operator[](&local_324,local_318);
            local_328 = (uint)*(byte *)&(in_stack_fffffffffffffad8->m_coords).m_low_color +
                        local_320;
            if ((-1 < local_328) && (local_328 <= local_31c)) {
              in_stack_fffffffffffffacf = (uchar)local_328;
              in_stack_fffffffffffffad0 =
                   (potential_solution *)
                   color_quad<unsigned_char,_int>::operator[](&local_324,local_318);
              *(uchar *)&(in_stack_fffffffffffffad0->m_coords).m_low_color =
                   in_stack_fffffffffffffacf;
              in_stack_fffffffffffffaca = (undefined1)(short)in_RDI[299];
              in_stack_fffffffffffffacb = (undefined1)((ushort)(short)in_RDI[299] >> 8);
              in_stack_fffffffffffffacc =
                   dxt1_block::pack_color
                             ((color_quad_u8 *)
                              CONCAT17(in_stack_fffffffffffffae7,
                                       CONCAT16(in_stack_fffffffffffffae6,
                                                CONCAT24(in_stack_fffffffffffffae4,
                                                         CONCAT22(in_stack_fffffffffffffae2,
                                                                  in_stack_fffffffffffffae0)))),
                              SUB81((ulong)in_stack_fffffffffffffad8 >> 0x38,0),
                              (uint)in_stack_fffffffffffffad8);
              dxt1_solution_coordinates::dxt1_solution_coordinates
                        (&local_32c,CONCAT11(in_stack_fffffffffffffacb,in_stack_fffffffffffffaca),
                         in_stack_fffffffffffffacc);
              dxt1_solution_coordinates::canonicalize(&in_stack_fffffffffffffad0->m_coords);
              evaluate_solution((dxt1_endpoint_optimizer *)
                                CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                                coords_00,SUB81((ulong)in_stack_fffffffffffffb28 >> 0x38,0));
            }
          }
        }
      }
    }
    if ((in_RDI[0x12e] == 0) || ((local_1e0 != 0 && (in_RDI[0x12e] == local_208)))) break;
    if (3 < *(uint *)(*in_RDI + 0x18)) {
      refine_solution(this_00,(int)refinement_level);
    }
  }
  if (1 < *(uint *)(*in_RDI + 0x18)) {
    if ((in_RDI[0x12e] != 0) && ((*(byte *)(*in_RDI + 0x1c) & 1) == 0)) {
      local_32d = false;
      bVar7 = potential_solution::are_selectors_all_equal(in_stack_fffffffffffffad8);
      if (bVar7) {
        local_32d = try_average_block_as_solid(in_stack_fffffffffffffb40);
      }
      if ((local_32d == false) && (*(int *)(*in_RDI + 0x18) == 4)) {
        optimize_endpoint_comps(in_stack_00001b70);
      }
    }
    if ((*(int *)(*in_RDI + 0x18) == 4) && (in_RDI[0x12e] != 0)) {
      try_combinatorial_encoding((dxt1_endpoint_optimizer *)CONCAT44(fVar17,fVar16));
    }
  }
  return_solution((dxt1_endpoint_optimizer *)CONCAT44(uVar9,in_stack_fffffffffffffb88));
  if ((*(byte *)(*in_RDI + 0x20) & 1) != 0) {
    *(int *)((long)in_RDI + (ulong)(*(uint *)(in_RDI + 0x121) & 3) * 4 + 0x8f8) = (int)in_RDI[299];
    *(int *)(in_RDI + 0x121) = (int)in_RDI[0x121] + 1;
  }
  vector<crnlib::unique_color_projection>::~vector
            ((vector<crnlib::unique_color_projection> *)in_stack_fffffffffffffad0);
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoints(vec3F& low_color, vec3F& high_color) {
  vec3F orig_low_color(low_color);
  vec3F orig_high_color(high_color);

  m_trial_solution.clear();

  uint num_passes;
  const int16* pProbe_table = g_uber_probe_table;
  uint probe_range;
  float dist_per_trial = .015625f;

  // How many probes, and the distance between each probe depends on the quality level.
  switch (m_pParams->m_quality) {
    case cCRNDXTQualitySuperFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 1;
      break;
    case cCRNDXTQualityFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityNormal:
      pProbe_table = g_normal_probe_table;
      probe_range = cNormalProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityBetter:
      pProbe_table = g_better_probe_table;
      probe_range = cBetterProbeTableSize;
      num_passes = 2;
      break;
    default:
      pProbe_table = g_uber_probe_table;
      probe_range = cUberProbeTableSize;
      num_passes = 4;
      break;
  }

  if (m_pParams->m_endpoint_caching) {
    // Try the previous X winning endpoints. This may not give us optimal results, but it may increase the probability of early outs while evaluating potential solutions.
    const uint num_prev_results = math::minimum<uint>(cMaxPrevResults, m_num_prev_results);
    for (uint i = 0; i < num_prev_results; i++)
      evaluate_solution(m_prev_results[i]);

    if (!m_best_solution.m_error) {
      // Got lucky - one of the previous endpoints is optimal.
      return_solution();
      return;
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityBetter) {
    //evaluate_solution(dxt1_solution_coordinates(low_color, high_color), true, &m_best_solution);
    //refine_solution();

    try_median4(orig_low_color, orig_high_color);
  }

  uint probe_low[cUberProbeTableSize * 2 + 1];
  uint probe_high[cUberProbeTableSize * 2 + 1];

  vec3F scaled_principle_axis[2];

  scaled_principle_axis[1] = m_principle_axis * dist_per_trial;
  scaled_principle_axis[1][0] *= 31.0f;
  scaled_principle_axis[1][1] *= 63.0f;
  scaled_principle_axis[1][2] *= 31.0f;

  scaled_principle_axis[0] = -scaled_principle_axis[1];

  //vec3F initial_ofs(scaled_principle_axis * (float)-probe_range);
  //initial_ofs[0] += .5f;
  //initial_ofs[1] += .5f;
  //initial_ofs[2] += .5f;

  low_color[0] = math::clamp(low_color[0] * 31.0f, 0.0f, 31.0f);
  low_color[1] = math::clamp(low_color[1] * 63.0f, 0.0f, 63.0f);
  low_color[2] = math::clamp(low_color[2] * 31.0f, 0.0f, 31.0f);

  high_color[0] = math::clamp(high_color[0] * 31.0f, 0.0f, 31.0f);
  high_color[1] = math::clamp(high_color[1] * 63.0f, 0.0f, 63.0f);
  high_color[2] = math::clamp(high_color[2] * 31.0f, 0.0f, 31.0f);

  int d[3];
  for (uint c = 0; c < 3; c++)
    d[c] = math::float_to_int_round((high_color[c] - low_color[c]) * (c == 0 ? m_perceptual ? 16 : 2 : c == 1 ? m_perceptual ? 25 : 1 : 2));
  crnlib::vector<unique_color_projection> evaluated_color_projections(m_evaluated_colors.size());
  int64 average_projection = d[0] * (high_color[0] + low_color[0]) * 4 + d[1] * (high_color[1] + low_color[1]) * 2 + d[2] * (high_color[2] + low_color[2]) * 4;
  for (uint i = 0; i < m_evaluated_colors.size(); i++) {
    int64 delta = d[0] * m_evaluated_colors[i].m_color[0] + d[1] * m_evaluated_colors[i].m_color[1] + d[2] * m_evaluated_colors[i].m_color[2] - average_projection;
    evaluated_color_projections[i].projection = delta * m_evaluated_colors[i].m_weight;
    evaluated_color_projections[i].color = m_evaluated_colors[i];
  }
  std::sort(evaluated_color_projections.begin(), evaluated_color_projections.end(), g_unique_color_projection_sort);
  for (uint i = 0, iEnd = m_evaluated_colors.size(); i < iEnd; i++)
    m_evaluated_colors[i] = evaluated_color_projections[i & 1 ? i >> 1 : iEnd - 1 - (i >> 1)].color;

  for (uint pass = 0; pass < num_passes; pass++) {
    // Now separately sweep or probe the low and high colors along the principle axis, both positively and negatively.
    // This results in two arrays of candidate low/high endpoints. Every unique combination of candidate endpoints is tried as a potential solution.
    // In higher quality modes, the various nearby lattice neighbors of each candidate endpoint are also explored, which allows the current solution to "wobble" or "migrate"
    // to areas with lower error.
    // This entire process can be repeated up to X times (depending on the quality level) until a local minimum is established.
    // This method is very stable and scalable. It could be implemented more elegantly, but I'm now very cautious of touching this code.
    if (pass) {
      color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
      low_color = vec3F(low.r, low.g, low.b);
      color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
      high_color = vec3F(high.r, high.g, high.b);
    }

    const uint64 prev_best_error = m_best_solution.m_error;
    if (!prev_best_error)
      break;

    // Sweep low endpoint along principle axis, record positions
    int prev_packed_color[2] = {-1, -1};
    uint num_low_trials = 0;
    vec3F initial_probe_low_color(low_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_low_color(initial_probe_low_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_low_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_low_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_low_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_low[num_low_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;

    // Sweep high endpoint along principle axis, record positions
    uint num_high_trials = 0;
    vec3F initial_probe_high_color(high_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_high_color(initial_probe_high_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_high_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_high_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_high_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_high[num_high_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    // Now try all unique combinations.
    for (uint i = 0; i < num_low_trials; i++) {
      for (uint j = 0; j < num_high_trials; j++) {
        dxt1_solution_coordinates coords((uint16)probe_low[i], (uint16)probe_high[j]);
        coords.canonicalize();
        evaluate_solution(coords);
      }
    }

    if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
      // Generate new candidates by exploring the low color's direct lattice neighbors
      color_quad_u8 lc(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));

      for (int i = 0; i < 26; i++) {
        int r = lc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = lc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = lc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(dxt1_block::pack_color(r, g, b, false), m_best_solution.m_coords.m_high_color);
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the low color's direct lattice neighbors - this time, explore much further separately on each axis.
        lc = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(lc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(dxt1_block::pack_color(c, false), m_best_solution.m_coords.m_high_color);
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }

      // Generate new candidates by exploring the high color's direct lattice neighbors
      color_quad_u8 hc(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));

      for (int i = 0; i < 26; i++) {
        int r = hc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = hc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = hc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(r, g, b, false));
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the high color's direct lattice neighbors - this time, explore much further separately on each axis.
        hc = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(hc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(c, false));
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }
    }

    if ((!m_best_solution.m_error) || ((pass) && (m_best_solution.m_error == prev_best_error)))
      break;

    if (m_pParams->m_quality >= cCRNDXTQualityUber) {
      // Attempt to refine current solution's endpoints given the current selectors using least squares.
      refine_solution(1);
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
    if ((m_best_solution.m_error) && (!m_pParams->m_pixels_have_alpha)) {
      bool choose_solid_block = false;
      if (m_best_solution.are_selectors_all_equal()) {
        // All selectors equal - try various solid-block optimizations
        choose_solid_block = try_average_block_as_solid();
      }

      if ((!choose_solid_block) && (m_pParams->m_quality == cCRNDXTQualityUber)) {
        // Per-component 1D endpoint optimization.
        optimize_endpoint_comps();
      }
    }

    if (m_pParams->m_quality == cCRNDXTQualityUber) {
      if (m_best_solution.m_error) {
        // The pixels may have already been DXTc compressed by another compressor.
        // It's usually possible to recover the endpoints used to previously pack the block.
        try_combinatorial_encoding();
      }
    }
  }

  return_solution();

  if (m_pParams->m_endpoint_caching) {
    // Remember result for later reruse.
    m_prev_results[m_num_prev_results & (cMaxPrevResults - 1)] = m_best_solution.m_coords;
    m_num_prev_results++;
  }
}